

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O2

string * muduo::ProcessInfo::threadStat_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char buf [64];
  
  CurrentThread::tid();
  snprintf(buf,0x40,"/proc/self/task/%d/stat");
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  FileUtil::readFile<std::__cxx11::string>
            ((StringArg)buf,0x10000,in_RDI,(int64_t *)0x0,(int64_t *)0x0,(int64_t *)0x0);
  return in_RDI;
}

Assistant:

string ProcessInfo::threadStat()
{
  char buf[64];
  snprintf(buf, sizeof buf, "/proc/self/task/%d/stat", CurrentThread::tid());
  string result;
  FileUtil::readFile(buf, 65536, &result);
  return result;
}